

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_sao.c
# Opt level: O2

void ihevc_sao_edge_offset_class3
               (UWORD8 *pu1_src,WORD32 src_strd,UWORD8 *pu1_src_left,UWORD8 *pu1_src_top,
               UWORD8 *pu1_src_top_left,UWORD8 *pu1_src_top_right,UWORD8 *pu1_src_bot_left,
               UWORD8 *pu1_avail,WORD8 *pi1_sao_offset,WORD32 wd,WORD32 ht)

{
  UWORD8 UVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  byte bVar12;
  byte bVar13;
  long lVar14;
  byte *pbVar15;
  byte bVar16;
  int iVar17;
  UWORD8 *pUVar18;
  uint uVar19;
  UWORD8 au1_src_left_tmp [64];
  UWORD8 au1_src_top_tmp [64];
  UWORD8 *local_158;
  byte abStack_139 [129];
  UWORD8 aUStack_b8 [64];
  UWORD8 aUStack_78 [72];
  
  lVar14 = (long)wd;
  abStack_139[1] = 0xff;
  abStack_139[2] = 0xff;
  abStack_139[3] = 0xff;
  abStack_139[4] = 0xff;
  abStack_139[5] = 0xff;
  abStack_139[6] = 0xff;
  abStack_139[7] = 0xff;
  abStack_139[8] = 0xff;
  abStack_139[9] = 0xff;
  abStack_139[10] = 0xff;
  abStack_139[0xb] = 0xff;
  abStack_139[0xc] = 0xff;
  abStack_139[0xd] = 0xff;
  abStack_139[0xe] = 0xff;
  abStack_139[0xf] = 0xff;
  abStack_139[0x10] = 0xff;
  abStack_139[0x11] = 0xff;
  abStack_139[0x12] = 0xff;
  abStack_139[0x13] = 0xff;
  abStack_139[0x14] = 0xff;
  abStack_139[0x15] = 0xff;
  abStack_139[0x16] = 0xff;
  abStack_139[0x17] = 0xff;
  abStack_139[0x18] = 0xff;
  abStack_139[0x19] = 0xff;
  abStack_139[0x1a] = 0xff;
  abStack_139[0x1b] = 0xff;
  abStack_139[0x1c] = 0xff;
  abStack_139[0x1d] = 0xff;
  abStack_139[0x1e] = 0xff;
  abStack_139[0x1f] = 0xff;
  abStack_139[0x20] = 0xff;
  abStack_139[0x21] = 0xff;
  abStack_139[0x22] = 0xff;
  abStack_139[0x23] = 0xff;
  abStack_139[0x24] = 0xff;
  abStack_139[0x25] = 0xff;
  abStack_139[0x26] = 0xff;
  abStack_139[0x27] = 0xff;
  abStack_139[0x28] = 0xff;
  abStack_139[0x29] = 0xff;
  abStack_139[0x2a] = 0xff;
  abStack_139[0x2b] = 0xff;
  abStack_139[0x2c] = 0xff;
  abStack_139[0x2d] = 0xff;
  abStack_139[0x2e] = 0xff;
  abStack_139[0x2f] = 0xff;
  abStack_139[0x30] = 0xff;
  abStack_139[0x31] = 0xff;
  abStack_139[0x32] = 0xff;
  abStack_139[0x33] = 0xff;
  abStack_139[0x34] = 0xff;
  abStack_139[0x35] = 0xff;
  abStack_139[0x36] = 0xff;
  abStack_139[0x37] = 0xff;
  abStack_139[0x38] = 0xff;
  abStack_139[0x39] = 0xff;
  abStack_139[0x3a] = 0xff;
  abStack_139[0x3b] = 0xff;
  abStack_139[0x3c] = 0xff;
  abStack_139[0x3d] = 0xff;
  abStack_139[0x3e] = 0xff;
  abStack_139[0x3f] = 0xff;
  abStack_139[0x40] = 0xff;
  uVar5 = lVar14 - 1;
  UVar1 = pu1_src_top[lVar14 + -1];
  uVar4 = 0;
  uVar7 = 0;
  if (0 < ht) {
    uVar7 = (ulong)(uint)ht;
  }
  pUVar18 = pu1_src + lVar14 + -1;
  for (; uVar7 != uVar4; uVar4 = uVar4 + 1) {
    aUStack_b8[uVar4] = *pUVar18;
    pUVar18 = pUVar18 + src_strd;
  }
  iVar10 = (ht + -1) * src_strd;
  uVar4 = 0;
  uVar7 = 0;
  if (0 < wd) {
    uVar7 = (ulong)(uint)wd;
  }
  for (; uVar7 != uVar4; uVar4 = uVar4 + 1) {
    aUStack_78[uVar4] = pu1_src[uVar4 + (long)iVar10];
  }
  bVar16 = pu1_src[uVar5];
  if (pu1_avail[5] != '\0') {
    uVar19 = bVar16 == *pu1_src_top_right ^ 3;
    if (bVar16 < *pu1_src_top_right) {
      uVar19 = 1;
    }
    uVar11 = 0xffffffff;
    if (pu1_src[src_strd + -2 + wd] <= bVar16) {
      uVar11 = (uint)(bVar16 != pu1_src[src_strd + -2 + wd]);
    }
    if (uVar11 + uVar19 != 2) {
      iVar6 = (int)pi1_sao_offset[gi4_ihevc_table_edge_idx[uVar11 + uVar19]] + (uint)bVar16;
      bVar16 = 0xff;
      if (iVar6 < 0x100) {
        iVar17 = 0;
        if (0 < iVar6) {
          iVar17 = iVar6;
        }
        bVar16 = (byte)iVar17;
      }
    }
  }
  bVar12 = pu1_src[iVar10];
  uVar19 = (uint)bVar12;
  if (pu1_avail[6] != '\0') {
    uVar11 = bVar12 == pu1_src[(iVar10 - src_strd) + 1] ^ 3;
    if (bVar12 < pu1_src[(iVar10 - src_strd) + 1]) {
      uVar11 = 1;
    }
    uVar3 = 0xffffffff;
    if (*pu1_src_bot_left <= bVar12) {
      uVar3 = (uint)(bVar12 != *pu1_src_bot_left);
    }
    if (uVar3 + uVar11 != 2) {
      uVar11 = (int)pi1_sao_offset[gi4_ihevc_table_edge_idx[uVar3 + uVar11]] + (uint)bVar12;
      uVar19 = 0xff;
      if (((int)uVar11 < 0x100) && (uVar19 = 0, 0 < (int)uVar11)) {
        uVar19 = uVar11;
      }
    }
  }
  if (*pu1_avail == '\0') {
    abStack_139[1] = 0;
    abStack_139[2] = 0xff;
    abStack_139[3] = 0xff;
    abStack_139[4] = 0xff;
  }
  if (pu1_avail[2] == '\0') {
    uVar4 = 0;
    uVar8 = 0;
    if (0 < (int)uVar5) {
      uVar8 = uVar5 & 0xffffffff;
    }
    for (; uVar8 != uVar4; uVar4 = uVar4 + 1) {
      bVar12 = (pu1_src + src_strd)[uVar4];
      bVar13 = bVar12 != pu1_src[uVar4 + 1];
      if (bVar12 < pu1_src[uVar4 + 1]) {
        bVar13 = 0xff;
      }
      abStack_139[uVar4 + 0x41] = bVar13;
    }
    local_158 = pu1_src_left + 1;
    pu1_src = pu1_src + src_strd;
    ht = ht + -1;
  }
  else {
    uVar4 = 0;
    uVar8 = 0;
    if (0 < (int)uVar5) {
      uVar8 = uVar5 & 0xffffffff;
    }
    for (; local_158 = pu1_src_left, uVar8 != uVar4; uVar4 = uVar4 + 1) {
      bVar12 = pu1_src[uVar4] != pu1_src_top[uVar4 + 1];
      if (pu1_src[uVar4] < pu1_src_top[uVar4 + 1]) {
        bVar12 = 0xff;
      }
      abStack_139[uVar4 + 0x41] = bVar12;
    }
  }
  if (pu1_avail[1] == '\0') {
    abStack_139[lVar14] = 0;
  }
  uVar11 = ht - (uint)(pu1_avail[3] == '\0');
  uVar4 = 0;
  uVar8 = 0;
  if (0 < (int)uVar11) {
    uVar8 = (ulong)uVar11;
  }
  pUVar18 = pu1_src + (long)src_strd + -1;
  while (uVar4 != uVar8) {
    bVar12 = pu1_src[uVar5] != pu1_src[wd - src_strd];
    if (pu1_src[uVar5] < pu1_src[wd - src_strd]) {
      bVar12 = 0xff;
    }
    abStack_139[lVar14 + 0x40] = bVar12;
    lVar2 = uVar4 + 1;
    uVar4 = uVar4 + 1;
    for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
      bVar12 = pu1_src[uVar9];
      pbVar15 = pUVar18 + uVar9;
      if (uVar9 == 0) {
        pbVar15 = local_158 + lVar2;
      }
      uVar3 = (uint)(*pbVar15 < bVar12);
      if (bVar12 < *pbVar15) {
        uVar3 = 0xffffffff;
      }
      if (uVar9 != 0) {
        abStack_139[uVar9 + 0x40] = -(char)uVar3;
      }
      if (((uint)abStack_139[uVar9 + 1] &
          gi4_ihevc_table_edge_idx[(long)(char)abStack_139[uVar9 + 0x41] + (long)(int)uVar3 + 2]) !=
          0) {
        iVar10 = (int)pi1_sao_offset
                      [(uint)abStack_139[uVar9 + 1] &
                       gi4_ihevc_table_edge_idx
                       [(long)(char)abStack_139[uVar9 + 0x41] + (long)(int)uVar3 + 2]] +
                 (uint)bVar12;
        if (iVar10 < 1) {
          iVar10 = 0;
        }
        if (0xfe < iVar10) {
          iVar10 = 0xff;
        }
        pu1_src[uVar9] = (UWORD8)iVar10;
      }
    }
    pu1_src = pu1_src + src_strd;
    pUVar18 = pUVar18 + src_strd;
  }
  uVar3 = uVar11;
  if (pu1_avail[2] == '\0') {
    uVar3 = uVar11 + 1;
  }
  pu1_src[(int)(~(uVar3 * src_strd) + wd)] = bVar16;
  uVar4 = 0;
  uVar5 = (long)-src_strd;
  if (pu1_avail[3] == '\0') {
    uVar5 = uVar4;
  }
  pu1_src[uVar5] = (UWORD8)uVar19;
  if (pu1_avail[2] == '\0') {
    uVar11 = uVar11 + 1;
  }
  uVar11 = uVar11 + (pu1_avail[3] == '\0');
  *pu1_src_top_left = UVar1;
  uVar5 = (ulong)uVar11;
  if ((int)uVar11 < 1) {
    uVar5 = uVar4;
  }
  for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    pu1_src_left[uVar4] = aUStack_b8[uVar4];
  }
  for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
    pu1_src_top[uVar5] = aUStack_78[uVar5];
  }
  return;
}

Assistant:

void ihevc_sao_edge_offset_class3(UWORD8 *pu1_src,
                                  WORD32 src_strd,
                                  UWORD8 *pu1_src_left,
                                  UWORD8 *pu1_src_top,
                                  UWORD8 *pu1_src_top_left,
                                  UWORD8 *pu1_src_top_right,
                                  UWORD8 *pu1_src_bot_left,
                                  UWORD8 *pu1_avail,
                                  WORD8 *pi1_sao_offset,
                                  WORD32 wd,
                                  WORD32 ht)
{
    WORD32 row, col;
    UWORD8 au1_mask[MAX_CTB_SIZE];
    UWORD8 au1_src_top_tmp[MAX_CTB_SIZE];
    UWORD8 au1_src_left_tmp[MAX_CTB_SIZE];
    UWORD8 u1_src_top_left_tmp;
    WORD8 au1_sign_up[MAX_CTB_SIZE];
    UWORD8 *pu1_src_left_cpy;
    WORD8 u1_sign_down;
    WORD32 bit_depth;

    UWORD8 u1_pos_0_ht_tmp;
    UWORD8 u1_pos_wd_0_tmp;

    bit_depth = BIT_DEPTH_LUMA;
    pu1_src_left_cpy = pu1_src_left;

    /* Initialize the mask values */
    memset(au1_mask, 0xFF, MAX_CTB_SIZE);

    /* Update left, top and top-left arrays */
    u1_src_top_left_tmp = pu1_src_top[wd - 1];
    for(row = 0; row < ht; row++)
    {
        au1_src_left_tmp[row] = pu1_src[row * src_strd + wd - 1];
    }
    for(col = 0; col < wd; col++)
    {
        au1_src_top_tmp[col] = pu1_src[(ht - 1) * src_strd + col];
    }

    /* If top-right is available, process separately */
    if(0 != pu1_avail[5])
    {
        WORD32 edge_idx;

        edge_idx = 2 + SIGN(pu1_src[wd - 1] - pu1_src_top_right[0]) +
                        SIGN(pu1_src[wd - 1] - pu1_src[wd - 1 - 1 + src_strd]);

        edge_idx = gi4_ihevc_table_edge_idx[edge_idx];

        if(0 != edge_idx)
        {
            u1_pos_wd_0_tmp = CLIP3(pu1_src[wd - 1] + pi1_sao_offset[edge_idx], 0, (1 << bit_depth) - 1);
        }
        else
        {
            u1_pos_wd_0_tmp = pu1_src[wd - 1];
        }
    }
    else
    {
        u1_pos_wd_0_tmp = pu1_src[wd - 1];
    }

    /* If bottom-left is available, process separately */
    if(0 != pu1_avail[6])
    {
        WORD32 edge_idx;

        edge_idx = 2 + SIGN(pu1_src[(ht - 1) * src_strd] - pu1_src[(ht - 1) * src_strd + 1 - src_strd]) +
                        SIGN(pu1_src[(ht - 1) * src_strd] - pu1_src_bot_left[0]);

        edge_idx = gi4_ihevc_table_edge_idx[edge_idx];

        if(0 != edge_idx)
        {
            u1_pos_0_ht_tmp = CLIP3(pu1_src[(ht - 1) * src_strd] + pi1_sao_offset[edge_idx], 0, (1 << bit_depth) - 1);
        }
        else
        {
            u1_pos_0_ht_tmp = pu1_src[(ht - 1) * src_strd];
        }
    }
    else
    {
        u1_pos_0_ht_tmp = pu1_src[(ht - 1) * src_strd];
    }

    /* If Left is not available */
    if(0 == pu1_avail[0])
    {
        au1_mask[0] = 0;
    }

    /* If Top is not available */
    if(0 == pu1_avail[2])
    {
        pu1_src += src_strd;
        ht--;
        pu1_src_left_cpy += 1;
        for(col = 0; col < wd - 1; col++)
        {
            au1_sign_up[col] = SIGN(pu1_src[col] - pu1_src[col + 1 - src_strd]);
        }
    }
    else
    {
        for(col = 0; col < wd - 1; col++)
        {
            au1_sign_up[col] = SIGN(pu1_src[col] - pu1_src_top[col + 1]);
        }
    }

    /* If Right is not available */
    if(0 == pu1_avail[1])
    {
        au1_mask[wd - 1] = 0;
    }

    /* If Bottom is not available */
    if(0 == pu1_avail[3])
    {
        ht--;
    }

    /* Processing is done on the intermediate buffer and the output is written to the source buffer */
    {
        for(row = 0; row < ht; row++)
        {
            au1_sign_up[wd - 1] = SIGN(pu1_src[wd - 1] - pu1_src[wd - 1 + 1 - src_strd]);
            for(col = 0; col < wd; col++)
            {
                WORD32 edge_idx;

                u1_sign_down = SIGN(pu1_src[col] - ((col == 0) ? pu1_src_left_cpy[row + 1] :
                                                                 pu1_src[col - 1 + src_strd]));
                edge_idx = 2 + au1_sign_up[col] + u1_sign_down;
                if(col > 0)
                    au1_sign_up[col - 1] = -u1_sign_down;

                edge_idx = gi4_ihevc_table_edge_idx[edge_idx] & au1_mask[col];

                if(0 != edge_idx)
                {
                    pu1_src[col] = CLIP3(pu1_src[col] + pi1_sao_offset[edge_idx], 0, (1 << bit_depth) - 1);
                }
            }

            pu1_src += src_strd;
        }

        pu1_src[-(pu1_avail[2] ? ht : ht + 1) * src_strd + wd - 1] = u1_pos_wd_0_tmp;
        pu1_src[(pu1_avail[3] ?  (-src_strd) : 0)] = u1_pos_0_ht_tmp;
    }

    if(0 == pu1_avail[2])
        ht++;
    if(0 == pu1_avail[3])
        ht++;
    *pu1_src_top_left = u1_src_top_left_tmp;
    for(row = 0; row < ht; row++)
    {
        pu1_src_left[row] = au1_src_left_tmp[row];
    }
    for(col = 0; col < wd; col++)
    {
        pu1_src_top[col] = au1_src_top_tmp[col];
    }

}